

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_matrix.c
# Opt level: O3

void rq_matrix_generate(m256v *M,parameters *P,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  int n_col;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t *ISIs;
  uint n_row;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined8 uStack_70;
  undefined1 local_68 [8];
  m256v HDPC;
  m256v LDPC;
  long lVar10;
  
  uVar3 = P->Kprime - P->K;
  n_row = uVar3 + n_ESIs;
  lVar2 = -((ulong)n_row * 4 + 0xf & 0xfffffffffffffff0);
  ISIs = (uint32_t *)(local_68 + lVar2);
  if (0 < n_ESIs) {
    uVar1 = P->K;
    uVar6 = 0;
    do {
      uVar7 = uVar3;
      if (ESIs[uVar6] < uVar1) {
        uVar7 = 0;
      }
      ISIs[uVar6] = uVar7 + ESIs[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uint)n_ESIs != uVar6);
  }
  if (0 < (int)uVar3) {
    uVar4 = P->K;
    lVar5 = (ulong)uVar3 - 1;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 1;
    auVar8 = auVar8 ^ _DAT_001040d0;
    auVar9 = _DAT_001040c0;
    do {
      auVar11 = auVar9 ^ _DAT_001040d0;
      if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                  auVar8._4_4_ < auVar11._4_4_) & 1)) {
        ISIs[(long)n_ESIs + lVar5 + -1] = uVar4;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        ISIs[n_ESIs + lVar5] = uVar4 + 1;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar10 = lVar5 - (ulong)(uVar3 + 1 & 0xfffffffe);
      lVar5 = lVar5 + 2;
      uVar4 = uVar4 + 2;
    } while (lVar10 != -1);
  }
  n_col = P->L;
  *(undefined8 *)(local_68 + lVar2 + -8) = 0x10154c;
  m256v_get_subview((m256v *)&HDPC.e,M,0,0,n_row,n_col);
  *(undefined8 *)(local_68 + lVar2 + -8) = 0x10155d;
  lt_generate_mat((m256v *)&HDPC.e,P,n_row,ISIs);
  uStack_70 = 0x10157d;
  m256v_get_subview((m256v *)&HDPC.e,M,n_row,0,P->S,P->L);
  uStack_70 = 0x101588;
  ldpc_generate_mat((m256v *)&HDPC.e,P);
  uStack_70 = 0x1015a8;
  m256v_get_subview((m256v *)local_68,M,n_row + P->S,0,P->H,P->L);
  uStack_70 = 0x1015b3;
  hdpc_generate_mat_faster((m256v *)local_68,P);
  return;
}

Assistant:

void rq_matrix_generate(m256v* M,
			const parameters* P,
			int n_ESIs,
			const uint32_t* ESIs)
{
	/* Check the matrix dimension */
	int n_rows, n_cols;
	rq_matrix_get_dim(P, n_ESIs, &n_rows, &n_cols);
	assert(n_rows == M->n_row);
	assert(n_cols == M->n_col);

	/* Write LT part of the matrix */
	int rowoffs = 0;
	{
		const int n_pad = P->Kprime - P->K;
		const int n_ISIs = n_ESIs + n_pad;

		/* Convert ESIs to ISIs, append padding symbols */
		uint32_t ISIs[n_ISIs];
		for (int i = 0; i < n_ESIs; ++i)
			ISIs[i] = ESIs[i] + (ESIs[i] >= P->K ? n_pad : 0);
		for (int i = 0; i < n_pad; ++i)
			ISIs[n_ESIs + i] = P->K + i;

		/* Write LT matrix */
		m256v LT = m256v_get_subview(M, 0, 0, n_ISIs, P->L);
		lt_generate_mat(&LT, P, n_ISIs, ISIs);

		rowoffs += n_ISIs;
	}

	/* Write LDPC part of the matrix */
	m256v LDPC = m256v_get_subview(M, rowoffs, 0, P->S, P->L);
	ldpc_generate_mat(&LDPC, P);
	rowoffs += P->S;

	/* Generate HDPC part of the matrix */
	m256v HDPC = m256v_get_subview(M, rowoffs, 0, P->H, P->L);
	hdpc_generate_mat(&HDPC, P);
	rowoffs += P->H;

	assert(rowoffs == n_rows);
}